

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAccount.h
# Opt level: O2

void __thiscall jbcoin::STAccount::add(STAccount *this,Serializer *s)

{
  SField *pSVar1;
  uint __line;
  int len;
  char *__assertion;
  
  pSVar1 = (this->super_STBase).fName;
  if (pSVar1->fieldValue < 0x100) {
    if (pSVar1->fieldType == STI_ACCOUNT) {
      len = 0x14;
      if (this->default_ != false) {
        len = 0;
      }
      Serializer::addVL(s,&this->value_,len);
      return;
    }
    __assertion = "fName->fieldType == STI_ACCOUNT";
    __line = 0x48;
  }
  else {
    __assertion = "fName->isBinary ()";
    __line = 0x47;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/STAccount.h"
                ,__line,"virtual void jbcoin::STAccount::add(Serializer &) const");
}

Assistant:

void
    add (Serializer& s) const override
    {
        assert (fName->isBinary ());
        assert (fName->fieldType == STI_ACCOUNT);

        // Preserve the serialization behavior of an STBlob:
        //  o If we are default (all zeros) serialize as an empty blob.
        //  o Otherwise serialize 160 bits.
        int const size = isDefault() ? 0 : uint160::bytes;
        s.addVL (value_.data(), size);
    }